

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

size_t HUF_compress_internal
                 (void *dst,size_t dstSize,void *src,size_t srcSize,uint maxSymbolValue,uint huffLog
                 ,HUF_nbStreams_e nbStreams,void *workSpace,size_t wkspSize,HUF_CElt *oldHufTable,
                 HUF_repeat *repeat,int flags)

{
  bool bVar1;
  bool bVar2;
  undefined1 *puVar3;
  uint uVar4;
  uint uVar5;
  size_t _var_err__;
  uint *puVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  ulong uVar11;
  BYTE *oend;
  size_t sVar12;
  BYTE *pBVar13;
  byte bVar14;
  HUF_CElt *pHVar15;
  uint maxSymbolValue_local;
  uint *local_68;
  undefined1 *local_60;
  BYTE *local_58;
  uint *local_50;
  HUF_CElt *local_48;
  ulong local_40;
  uint maxSymbolValueEnd;
  uint maxSymbolValueBegin;
  
  maxSymbolValue_local = maxSymbolValue;
  local_60 = (undefined1 *)src;
  puVar6 = (uint *)HUF_alignUpWorkspace(workSpace,&wkspSize,8);
  puVar3 = local_60;
  if (wkspSize < 0x1f08) {
    return 0xffffffffffffffbe;
  }
  if (dstSize == 0 || srcSize == 0) {
    return 0;
  }
  if (0x20000 < srcSize) {
    return 0xffffffffffffffb8;
  }
  if (0xc < huffLog) {
    return 0xffffffffffffffd4;
  }
  sVar12 = 0xffffffffffffffd2;
  if (0xff < maxSymbolValue) {
    return 0xffffffffffffffd2;
  }
  if (maxSymbolValue == 0) {
    maxSymbolValue_local = 0xff;
  }
  uVar5 = maxSymbolValue_local;
  uVar4 = 0xb;
  if (huffLog != 0) {
    uVar4 = huffLog;
  }
  oend = (BYTE *)((long)dst + dstSize);
  bVar14 = repeat != (HUF_repeat *)0x0 & (byte)((flags & 4U) >> 2);
  pBVar13 = (BYTE *)dst;
  if ((bVar14 == 1) && (pHVar15 = oldHufTable, *repeat == HUF_repeat_valid)) goto LAB_0015b44a;
  local_50 = (uint *)CONCAT44(local_50._4_4_,uVar4);
  local_68 = puVar6;
  local_58 = oend;
  if (0x9fff < srcSize && (flags & 8U) != 0) {
    maxSymbolValueBegin = maxSymbolValue_local;
    uVar4 = HIST_count_simple(puVar6,&maxSymbolValueBegin,local_60,0x1000);
    sVar12 = (size_t)uVar4;
    maxSymbolValueEnd = uVar5;
    uVar5 = HIST_count_simple(local_68,&maxSymbolValueEnd,puVar3 + (srcSize - 0x1000),0x1000);
    if (uVar5 + sVar12 < 0x45) {
      return 0;
    }
  }
  pHVar15 = oldHufTable;
  puVar6 = local_68 + 0x302;
  sVar7 = HIST_count_wksp(local_68,&maxSymbolValue_local,local_60,srcSize,puVar6,0x1000);
  uVar5 = maxSymbolValue_local;
  if (sVar7 < 0xffffffffffffff89) {
    if (sVar7 == srcSize) {
      *(undefined1 *)dst = *local_60;
      bVar2 = false;
      sVar7 = 1;
    }
    else {
      uVar9 = (srcSize >> 7) + 4;
      bVar2 = uVar9 < sVar7;
      bVar1 = sVar7 <= uVar9;
      sVar7 = sVar12;
      if (bVar1) {
        sVar7 = 0;
      }
    }
  }
  else {
    bVar2 = false;
  }
  if (!bVar2) {
    return sVar7;
  }
  if (((repeat != (HUF_repeat *)0x0) && (*repeat == HUF_repeat_check)) &&
     (-1 < (int)maxSymbolValue_local)) {
    lVar10 = 0;
    bVar2 = false;
    do {
      bVar2 = (bool)(bVar2 | ((char)pHVar15[lVar10 + 1] == '\0' && local_68[lVar10] != 0));
      lVar10 = lVar10 + 1;
    } while ((ulong)maxSymbolValue_local + 1 != lVar10);
    if (bVar2) {
      *repeat = HUF_repeat_none;
    }
  }
  if ((bVar14 != 0) && (oend = local_58, *repeat != HUF_repeat_none)) goto LAB_0015b44a;
  uVar9 = (ulong)maxSymbolValue_local;
  pHVar15 = (HUF_CElt *)(local_68 + 0x100);
  uVar4 = HUF_optimalTableLog((uint)local_50,srcSize,maxSymbolValue_local,puVar6,0x1300,pHVar15,
                              local_68,flags);
  local_50 = puVar6;
  local_40 = uVar9;
  sVar12 = HUF_buildCTable_wksp(pHVar15,local_68,uVar5,uVar4,puVar6,0x1300);
  uVar9 = local_40;
  if (0xffffffffffffff88 < sVar12) {
    return sVar12;
  }
  uVar5 = (uint)local_40;
  memset(pHVar15 + (uVar5 + 2),0,(ulong)(uVar5 + 2) * -8 + 0x808);
  local_48 = pHVar15;
  sVar12 = HUF_writeCTable_wksp(dst,dstSize,pHVar15,uVar5,(uint)sVar12,local_50,0x2ec);
  if (sVar12 < 0xffffffffffffff89) {
    if ((repeat != (HUF_repeat *)0x0) && (*repeat != HUF_repeat_none)) {
      if ((int)uVar5 < 0) {
        uVar8 = 0;
      }
      else {
        lVar10 = 0;
        uVar8 = 0;
        do {
          uVar8 = uVar8 + (ulong)local_68[lVar10] * (ulong)(byte)oldHufTable[lVar10 + 1];
          lVar10 = lVar10 + 1;
        } while (uVar9 + 1 != lVar10);
        uVar8 = uVar8 >> 3;
      }
      if ((int)uVar5 < 0) {
        uVar11 = 0;
      }
      else {
        lVar10 = 0;
        uVar11 = 0;
        do {
          uVar11 = uVar11 + (ulong)local_68[lVar10] * (ulong)(byte)local_68[lVar10 * 2 + 0x102];
          lVar10 = lVar10 + 1;
        } while (uVar9 + 1 != lVar10);
        uVar11 = uVar11 >> 3;
      }
      if (srcSize <= sVar12 + 0xc || uVar8 <= uVar11 + sVar12) {
        sVar12 = HUF_compressCTable_internal
                           ((BYTE *)dst,(BYTE *)dst,local_58,local_60,srcSize,nbStreams,oldHufTable,
                            flags);
        bVar2 = false;
        goto LAB_0015b663;
      }
    }
    if (sVar12 + 0xc < srcSize) {
      if (repeat != (HUF_repeat *)0x0) {
        *repeat = HUF_repeat_none;
      }
      pBVar13 = (BYTE *)(sVar12 + (long)dst);
      bVar2 = true;
      sVar12 = sVar7;
      if (oldHufTable != (HUF_CElt *)0x0) {
        memcpy(oldHufTable,local_48,0x808);
      }
    }
    else {
      bVar2 = false;
      sVar12 = 0;
    }
  }
  else {
    bVar2 = false;
  }
LAB_0015b663:
  oend = local_58;
  pHVar15 = local_48;
  if (!bVar2) {
    return sVar12;
  }
LAB_0015b44a:
  sVar12 = HUF_compressCTable_internal
                     ((BYTE *)dst,pBVar13,oend,local_60,srcSize,nbStreams,pHVar15,flags);
  return sVar12;
}

Assistant:

static size_t
HUF_compress_internal (void* dst, size_t dstSize,
                 const void* src, size_t srcSize,
                       unsigned maxSymbolValue, unsigned huffLog,
                       HUF_nbStreams_e nbStreams,
                       void* workSpace, size_t wkspSize,
                       HUF_CElt* oldHufTable, HUF_repeat* repeat, int flags)
{
    HUF_compress_tables_t* const table = (HUF_compress_tables_t*)HUF_alignUpWorkspace(workSpace, &wkspSize, ZSTD_ALIGNOF(size_t));
    BYTE* const ostart = (BYTE*)dst;
    BYTE* const oend = ostart + dstSize;
    BYTE* op = ostart;

    DEBUGLOG(5, "HUF_compress_internal (srcSize=%zu)", srcSize);
    HUF_STATIC_ASSERT(sizeof(*table) + HUF_WORKSPACE_MAX_ALIGNMENT <= HUF_WORKSPACE_SIZE);

    /* checks & inits */
    if (wkspSize < sizeof(*table)) return ERROR(workSpace_tooSmall);
    if (!srcSize) return 0;  /* Uncompressed */
    if (!dstSize) return 0;  /* cannot fit anything within dst budget */
    if (srcSize > HUF_BLOCKSIZE_MAX) return ERROR(srcSize_wrong);   /* current block size limit */
    if (huffLog > HUF_TABLELOG_MAX) return ERROR(tableLog_tooLarge);
    if (maxSymbolValue > HUF_SYMBOLVALUE_MAX) return ERROR(maxSymbolValue_tooLarge);
    if (!maxSymbolValue) maxSymbolValue = HUF_SYMBOLVALUE_MAX;
    if (!huffLog) huffLog = HUF_TABLELOG_DEFAULT;

    /* Heuristic : If old table is valid, use it for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat == HUF_repeat_valid) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* If uncompressible data is suspected, do a smaller sampling first */
    DEBUG_STATIC_ASSERT(SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO >= 2);
    if ((flags & HUF_flags_suspectUncompressible) && srcSize >= (SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE * SUSPECT_INCOMPRESSIBLE_SAMPLE_RATIO)) {
        size_t largestTotal = 0;
        DEBUGLOG(5, "input suspected incompressible : sampling to check");
        {   unsigned maxSymbolValueBegin = maxSymbolValue;
            CHECK_V_F(largestBegin, HIST_count_simple (table->count, &maxSymbolValueBegin, (const BYTE*)src, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestBegin;
        }
        {   unsigned maxSymbolValueEnd = maxSymbolValue;
            CHECK_V_F(largestEnd, HIST_count_simple (table->count, &maxSymbolValueEnd, (const BYTE*)src + srcSize - SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE, SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) );
            largestTotal += largestEnd;
        }
        if (largestTotal <= ((2 * SUSPECT_INCOMPRESSIBLE_SAMPLE_SIZE) >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }

    /* Scan input and build symbol stats */
    {   CHECK_V_F(largest, HIST_count_wksp (table->count, &maxSymbolValue, (const BYTE*)src, srcSize, table->wksps.hist_wksp, sizeof(table->wksps.hist_wksp)) );
        if (largest == srcSize) { *ostart = ((const BYTE*)src)[0]; return 1; }   /* single symbol, rle */
        if (largest <= (srcSize >> 7)+4) return 0;   /* heuristic : probably not compressible enough */
    }
    DEBUGLOG(6, "histogram detail completed (%zu symbols)", showU32(table->count, maxSymbolValue+1));

    /* Check validity of previous table */
    if ( repeat
      && *repeat == HUF_repeat_check
      && !HUF_validateCTable(oldHufTable, table->count, maxSymbolValue)) {
        *repeat = HUF_repeat_none;
    }
    /* Heuristic : use existing table for small inputs */
    if ((flags & HUF_flags_preferRepeat) && repeat && *repeat != HUF_repeat_none) {
        return HUF_compressCTable_internal(ostart, op, oend,
                                           src, srcSize,
                                           nbStreams, oldHufTable, flags);
    }

    /* Build Huffman Tree */
    huffLog = HUF_optimalTableLog(huffLog, srcSize, maxSymbolValue, &table->wksps, sizeof(table->wksps), table->CTable, table->count, flags);
    {   size_t const maxBits = HUF_buildCTable_wksp(table->CTable, table->count,
                                            maxSymbolValue, huffLog,
                                            &table->wksps.buildCTable_wksp, sizeof(table->wksps.buildCTable_wksp));
        CHECK_F(maxBits);
        huffLog = (U32)maxBits;
        DEBUGLOG(6, "bit distribution completed (%zu symbols)", showCTableBits(table->CTable + 1, maxSymbolValue+1));
    }
    /* Zero unused symbols in CTable, so we can check it for validity */
    {
        size_t const ctableSize = HUF_CTABLE_SIZE_ST(maxSymbolValue);
        size_t const unusedSize = sizeof(table->CTable) - ctableSize * sizeof(HUF_CElt);
        ZSTD_memset(table->CTable + ctableSize, 0, unusedSize);
    }

    /* Write table description header */
    {   CHECK_V_F(hSize, HUF_writeCTable_wksp(op, dstSize, table->CTable, maxSymbolValue, huffLog,
                                              &table->wksps.writeCTable_wksp, sizeof(table->wksps.writeCTable_wksp)) );
        /* Check if using previous huffman table is beneficial */
        if (repeat && *repeat != HUF_repeat_none) {
            size_t const oldSize = HUF_estimateCompressedSize(oldHufTable, table->count, maxSymbolValue);
            size_t const newSize = HUF_estimateCompressedSize(table->CTable, table->count, maxSymbolValue);
            if (oldSize <= hSize + newSize || hSize + 12 >= srcSize) {
                return HUF_compressCTable_internal(ostart, op, oend,
                                                   src, srcSize,
                                                   nbStreams, oldHufTable, flags);
        }   }

        /* Use the new huffman table */
        if (hSize + 12ul >= srcSize) { return 0; }
        op += hSize;
        if (repeat) { *repeat = HUF_repeat_none; }
        if (oldHufTable)
            ZSTD_memcpy(oldHufTable, table->CTable, sizeof(table->CTable));  /* Save new table */
    }
    return HUF_compressCTable_internal(ostart, op, oend,
                                       src, srcSize,
                                       nbStreams, table->CTable, flags);
}